

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flex.cpp
# Opt level: O3

Element ftxui::yflex(Element *child)

{
  shared_ptr<ftxui::(anonymous_namespace)::Flex> sVar1;
  Element EVar2;
  element_type *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_20;
  
  sVar1 = std::
          make_shared<ftxui::(anonymous_namespace)::Flex,void(&)(ftxui::Requirement&),std::shared_ptr<ftxui::Node>>
                    ((_func_void_Requirement_ptr *)&local_28,
                     (shared_ptr<ftxui::Node> *)anon_unknown_2::function_yflex);
  EVar2.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
       sVar1.super___shared_ptr<ftxui::(anonymous_namespace)::Flex,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  (child->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = local_28;
  (child->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       p_Stack_20;
  EVar2.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)child;
  return (Element)EVar2.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element yflex(Element child) {
  return std::make_shared<Flex>(function_yflex, std::move(child));
}